

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBarBuf.c
# Opt level: O0

int Abc_NtkCheckSingleInstance(Abc_Ntk_t *pNtk)

{
  Abc_Ntk_t *pNtk_00;
  int iVar1;
  uint uVar2;
  void *pvVar3;
  Abc_Ntk_t *pNtk_01;
  Abc_Obj_t *pObj;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  int local_3c;
  int local_38;
  int RetValue;
  int k;
  int i;
  Abc_Obj_t *pBox;
  Abc_Ntk_t *pModel;
  Abc_Ntk_t *pTemp;
  Abc_Ntk_t *pNtk_local;
  
  local_3c = 1;
  if (pNtk->pDesign == (Abc_Des_t *)0x0) {
    pNtk_local._4_4_ = 1;
  }
  else {
    for (RetValue = 0; iVar1 = Vec_PtrSize(pNtk->pDesign->vModules), RetValue < iVar1;
        RetValue = RetValue + 1) {
      pvVar3 = Vec_PtrEntry(pNtk->pDesign->vModules,RetValue);
      *(undefined4 *)((long)pvVar3 + 0xc0) = 0;
    }
    for (RetValue = 0; iVar1 = Vec_PtrSize(pNtk->pDesign->vModules), RetValue < iVar1;
        RetValue = RetValue + 1) {
      pNtk_01 = (Abc_Ntk_t *)Vec_PtrEntry(pNtk->pDesign->vModules,RetValue);
      for (local_38 = 0; iVar1 = Vec_PtrSize(pNtk_01->vBoxes), local_38 < iVar1;
          local_38 = local_38 + 1) {
        pObj = Abc_NtkBox(pNtk_01,local_38);
        pNtk_00 = (Abc_Ntk_t *)(pObj->field_5).pData;
        if (pNtk_00 != (Abc_Ntk_t *)0x0) {
          iVar1 = Abc_NtkLatchNum(pNtk_00);
          if (0 < iVar1) {
            pcVar4 = Abc_NtkName(pNtk);
            uVar2 = Abc_NtkLatchNum(pNtk_00);
            printf("Network \"%s\" contains %d flops.\n",pcVar4,(ulong)uVar2);
            local_3c = 0;
          }
          if (pNtk_00->fHieVisited != 0) {
            pcVar4 = Abc_NtkName(pNtk);
            pcVar5 = Abc_ObjName(pObj);
            pcVar6 = Abc_NtkName(pNtk_00);
            printf("Network \"%s\" contains box \"%s\" whose model \"%s\" is instantiated more than once.\n"
                   ,pcVar4,pcVar5,pcVar6);
            local_3c = 0;
          }
          pNtk_00->fHieVisited = 1;
        }
      }
    }
    for (RetValue = 0; iVar1 = Vec_PtrSize(pNtk->pDesign->vModules), RetValue < iVar1;
        RetValue = RetValue + 1) {
      pvVar3 = Vec_PtrEntry(pNtk->pDesign->vModules,RetValue);
      *(undefined4 *)((long)pvVar3 + 0xc0) = 0;
    }
    pNtk_local._4_4_ = local_3c;
  }
  return pNtk_local._4_4_;
}

Assistant:

int Abc_NtkCheckSingleInstance( Abc_Ntk_t * pNtk )
{
    Abc_Ntk_t * pTemp, * pModel;
    Abc_Obj_t * pBox;
    int i, k, RetValue = 1;
    if ( pNtk->pDesign == NULL )
        return 1;
    Vec_PtrForEachEntry( Abc_Ntk_t *, pNtk->pDesign->vModules, pTemp, i )
        pTemp->fHieVisited = 0;
    Vec_PtrForEachEntry( Abc_Ntk_t *, pNtk->pDesign->vModules, pTemp, i )
        Abc_NtkForEachBox( pTemp, pBox, k )
        {
            pModel = (Abc_Ntk_t *)pBox->pData;
            if ( pModel == NULL )
                continue;
            if ( Abc_NtkLatchNum(pModel) > 0 )
            {
                printf( "Network \"%s\" contains %d flops.\n",                     
                    Abc_NtkName(pNtk), Abc_NtkLatchNum(pModel) );
                RetValue = 0;
            }
            if ( pModel->fHieVisited )
            {
                printf( "Network \"%s\" contains box \"%s\" whose model \"%s\" is instantiated more than once.\n", 
                    Abc_NtkName(pNtk), Abc_ObjName(pBox), Abc_NtkName(pModel) );
                RetValue = 0;
            }
            pModel->fHieVisited = 1;
        }